

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O3

Task * AI::create_Bother(void)

{
  vector<AI::Task,_std::allocator<AI::Task>_> *this;
  pointer pTVar1;
  Task *in_RDI;
  Task bother;
  Task bark;
  Task wait;
  string local_ac0;
  string local_aa0;
  Task local_a80;
  Task local_708;
  Task local_390;
  
  local_aa0._M_dataplus._M_p = (pointer)&local_aa0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa0,"bother","");
  Task::Task(in_RDI,&local_aa0,Compound);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  local_708.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xffffffff00000000;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(in_RDI->preconditions).satisfiedPredicates,(SatisfiablePredicateParams *)&local_708);
  create_Bark(&local_708,Bother);
  local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac0,"bother","");
  Task::Task(&local_a80,&local_ac0,Simple);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  local_a80.action = BotherPlayer;
  create_Wait(&local_390,3.0);
  this = &in_RDI->subtasks;
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_start != pTVar1) {
    pTVar1[-1].isLastInCompound = false;
  }
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_708);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar1[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar1;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_a80);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar1[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar1;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_390);
  (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].isLastInCompound = true;
  Task::~Task(&local_390);
  Task::~Task(&local_a80);
  Task::~Task(&local_708);
  return in_RDI;
}

Assistant:

Task create_Bother()
	{
		Task botherGroup {"bother", TaskType::Compound};
		botherGroup.preconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer, -1});

		auto bark = create_Bark(Bark::Bother);

		Task bother {"bother"};
		bother.action = Action::BotherPlayer;		
		
		auto wait = create_Wait(3);

		botherGroup.addSubtask(bark);
		botherGroup.addSubtask(bother);
		botherGroup.addSubtask(wait);

		return botherGroup;
	}